

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O1

void __thiscall iaf_psc_alpha::handleEvent(iaf_psc_alpha *this,Event *e)

{
  double dVar1;
  
  if (e->type == Current) {
    this->y0_ = *(double *)&e[1].type * (double)e[1]._vptr_Event + this->y0_;
  }
  else if (e->type == Spike) {
    dVar1 = (double)*(int *)&e[1]._vptr_Event * *(double *)&e[1].type;
    if (0.0 < dVar1) {
      this->ex_spikes_ = dVar1 + this->ex_spikes_;
      return;
    }
    this->in_spikes_ = dVar1 + this->in_spikes_;
    return;
  }
  return;
}

Assistant:

void iaf_psc_alpha::handleEvent(Event* e) {
    if(e->type == EventType::Spike) {
        double weighted = static_cast<SpikeEvent*>(e)->weight * static_cast<SpikeEvent*>(e)->multiplicity;
        if(weighted > 0.0) {
            ex_spikes_ += weighted;
        }
        else {
            in_spikes_ += weighted;
        }
    }
    else if(e->type == EventType::Current) {
        y0_ += static_cast<CurrentEvent*>(e)->weight * static_cast<CurrentEvent*>(e)->current;
    }
}